

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

char * square_apparent_look_in_preposition(chunk_conflict *c,loc grid)

{
  square *psVar1;
  char *pcVar2;
  feature *pfVar3;
  
  psVar1 = square(c,grid);
  pfVar3 = f_info + psVar1->feat;
  if (f_info[psVar1->feat].mimic != (feature *)0x0) {
    pfVar3 = f_info[psVar1->feat].mimic;
  }
  pcVar2 = "on ";
  if (pfVar3->look_in_preposition != (char *)0x0) {
    pcVar2 = pfVar3->look_in_preposition;
  }
  return pcVar2;
}

Assistant:

const char *square_apparent_look_in_preposition(struct chunk *c, struct loc grid) {
	int actual = square(c, grid)->feat;
	const struct feature *fp = f_info[actual].mimic ?
		f_info[actual].mimic : &f_info[actual];
	return (fp->look_in_preposition) ?  fp->look_in_preposition : "on ";
}